

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter.c
# Opt level: O0

void xml_reporter_finish_test(TestReporter *reporter,char *filename,int line,char *message)

{
  int iVar1;
  char *in_RDI;
  xml_suite_context *ctx;
  undefined4 in_stack_00000010;
  xml_suite_context *in_stack_00001000;
  
  iVar1 = context_stack_p + -1;
  reporter_finish_test((TestReporter *)CONCAT44(line,in_stack_00000010),message,ctx._4_4_,in_RDI);
  xmlFreeTextWriter(child_output_writer);
  xmlFormatProp((xmlNodePtr)((double)*(uint *)(in_RDI + 0x60) / 1000.0),
                (xmlChar *)context_stack[iVar1].curTest,"time","%.5f");
  context_stack[iVar1].suite_duration =
       *(int *)(in_RDI + 0x60) + context_stack[iVar1].suite_duration;
  insert_child_results(in_stack_00001000);
  return;
}

Assistant:

static void xml_reporter_finish_test(TestReporter *reporter, const char *filename, int line, const char *message) {
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    FILE *out = file_stack[file_stack_p-1];

    reporter_finish_test(reporter, filename, line, message);
    memo->printer(out, " time=\"%.5f\">\n", (double)reporter->duration/(double)1000);
    if (output && strlen(output) == 0) {
        free(output);
        output = NULL;
    }

    transfer_output_from(child_output_tmpfile, memo->printer, out);

    memo->printer(out, indent(reporter));
    memo->printer(out, "</testcase>\n");
    fflush(out);
}